

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

idx_t duckdb::FindTypedRangeBound<int,duckdb::GreaterThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  WindowColumnIterator<int> __last;
  WindowColumnIterator<int> __first;
  bool bVar1;
  undefined8 uVar2;
  pointer in_RCX;
  pointer in_RDX;
  WindowCursor *in_RSI;
  WindowCursor *in_RDI;
  char in_R8B;
  ulong *in_stack_00000010;
  int second;
  int first;
  WindowColumnIterator<int> end;
  WindowColumnIterator<int> begin;
  int cur_val_1;
  int cur_val;
  OperationCompare<int,_duckdb::GreaterThan> comp;
  int val;
  string *in_stack_fffffffffffffe68;
  WindowColumnIterator<int> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  idx_t in_stack_fffffffffffffe88;
  WindowCursor *in_stack_fffffffffffffe90;
  allocator *paVar3;
  WindowColumnIterator<int> local_108;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  WindowCursor *in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  WindowCursor *in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  allocator local_c1;
  string local_c0 [32];
  int local_a0;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [52];
  int local_64;
  int local_3c;
  char local_29;
  pointer local_28;
  pointer local_20;
  WindowCursor *local_18;
  WindowCursor *local_10;
  ulong local_8;
  
  local_29 = in_R8B;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_3c = WindowInputExpression::GetCell<int>
                       ((WindowInputExpression *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
                       );
  OperationCompare<int,_duckdb::GreaterThan>::OperationCompare
            ((OperationCompare<int,_duckdb::GreaterThan> *)0x1a5a992);
  if (local_29 == '\a') {
    local_64 = WindowCursor::GetCell<int>
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    bVar1 = OperationCompare<int,_duckdb::GreaterThan>::operator()
                      ((OperationCompare<int,_duckdb::GreaterThan> *)in_stack_fffffffffffffe70,
                       (int *)in_stack_fffffffffffffe68,(int *)0x1a5a9ea);
    if (bVar1) {
      local_9a = 1;
      uVar2 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"Invalid RANGE PRECEDING value",&local_99);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      local_9a = 0;
      __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  else {
    local_a0 = WindowCursor::GetCell<int>
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    bVar1 = OperationCompare<int,_duckdb::GreaterThan>::operator()
                      ((OperationCompare<int,_duckdb::GreaterThan> *)in_stack_fffffffffffffe70,
                       (int *)in_stack_fffffffffffffe68,(int *)0x1a5ab34);
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar3 = &local_c1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"Invalid RANGE FOLLOWING value",paVar3);
      OutOfRangeException::OutOfRangeException
                ((OutOfRangeException *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  WindowColumnIterator<int>::WindowColumnIterator
            ((WindowColumnIterator<int> *)&stack0xffffffffffffff28,local_10,local_20);
  WindowColumnIterator<int>::WindowColumnIterator
            ((WindowColumnIterator<int> *)&stack0xffffffffffffff18,local_18,local_28);
  if (*in_stack_00000010 < in_stack_00000010[1]) {
    if ((local_20 <= *in_stack_00000010) && (*in_stack_00000010 < local_28)) {
      in_stack_fffffffffffffe84 =
           WindowCursor::GetCell<int>
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      in_stack_ffffffffffffff14 = in_stack_fffffffffffffe84;
    }
    if ((local_20 < in_stack_00000010[1]) && (in_stack_00000010[1] < local_28)) {
      in_stack_ffffffffffffff10 =
           WindowCursor::GetCell<int>
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      bVar1 = OperationCompare<int,_duckdb::GreaterThan>::operator()
                        ((OperationCompare<int,_duckdb::GreaterThan> *)in_stack_fffffffffffffe70,
                         (int *)in_stack_fffffffffffffe68,(int *)0x1a5ad4f);
      if (!bVar1) {
        bVar1 = OperationCompare<int,_duckdb::GreaterThan>::operator()
                          ((OperationCompare<int,_duckdb::GreaterThan> *)in_stack_fffffffffffffe70,
                           (int *)in_stack_fffffffffffffe68,(int *)0x1a5ad70);
        if (!bVar1) {
          local_8 = in_stack_00000010[1];
          goto LAB_01a5ae98;
        }
        UnsafeNumericCast<long,unsigned_long,void>((local_28 - in_stack_00000010[1]) - 1);
        WindowColumnIterator<int>::operator-=
                  (in_stack_fffffffffffffe70,(difference_type)in_stack_fffffffffffffe68);
      }
    }
  }
  OperationCompare<int,_duckdb::GreaterThan>::OperationCompare
            ((OperationCompare<int,_duckdb::GreaterThan> *)in_stack_fffffffffffffe70,
             (OperationCompare<int,_duckdb::GreaterThan> *)in_stack_fffffffffffffe68);
  __first.pos = in_stack_ffffffffffffff30;
  __first.coll = in_stack_ffffffffffffff28;
  __last.pos = in_stack_ffffffffffffff20;
  __last.coll = in_stack_ffffffffffffff18;
  local_108 = ::std::
              upper_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::GreaterThan>>
                        (__first,__last,
                         (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (OperationCompare<int,_duckdb::GreaterThan> *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_8 = WindowColumnIterator::operator_cast_to_unsigned_long((WindowColumnIterator *)&local_108)
  ;
  OperationCompare<int,_duckdb::GreaterThan>::~OperationCompare
            ((OperationCompare<int,_duckdb::GreaterThan> *)0x1a5ae6b);
LAB_01a5ae98:
  OperationCompare<int,_duckdb::GreaterThan>::~OperationCompare
            ((OperationCompare<int,_duckdb::GreaterThan> *)0x1a5aea5);
  return local_8;
}

Assistant:

static idx_t FindTypedRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                                 const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                                 const idx_t chunk_idx, const FrameBounds &prev) {
	D_ASSERT(!boundary.CellIsNull(chunk_idx));
	const auto val = boundary.GetCell<T>(chunk_idx);

	OperationCompare<T, OP> comp;

	// Check that the value we are searching for is in range.
	if (range == WindowBoundary::EXPR_PRECEDING_RANGE) {
		//	Preceding but value past the current value
		const auto cur_val = range_hi.GetCell<T>(0, order_end - 1);
		if (comp(cur_val, val)) {
			throw OutOfRangeException("Invalid RANGE PRECEDING value");
		}
	} else {
		//	Following but value before the current value
		D_ASSERT(range == WindowBoundary::EXPR_FOLLOWING_RANGE);
		const auto cur_val = range_lo.GetCell<T>(0, order_begin);
		if (comp(val, cur_val)) {
			throw OutOfRangeException("Invalid RANGE FOLLOWING value");
		}
	}
	//	Try to reuse the previous bounds to restrict the search.
	//	This is only valid if the previous bounds were non-empty
	WindowColumnIterator<T> begin(range_lo, order_begin);
	WindowColumnIterator<T> end(range_hi, order_end);
	if (prev.start < prev.end) {
		if (order_begin <= prev.start && prev.start < order_end) {
			const auto first = range_lo.GetCell<T>(0, prev.start);
			if (FROM && !comp(val, first)) {
				// If prev.start == val and we are looking for a lower bound, then we are done
				if (!comp(first, val)) {
					return prev.start;
				}
				//	prev.start <= val, so we can start further forward
				begin += UnsafeNumericCast<int64_t>(prev.start - order_begin);
			}
		}
		if (order_begin < prev.end && prev.end < order_end) {
			const auto second = range_hi.GetCell<T>(0, prev.end - 1);
			if (!comp(second, val)) {
				//  If val == prev.end and we are looking for an upper bound, then we are done
				if (!FROM && !comp(val, second)) {
					return prev.end;
				}
				//	val <= prev.end, so we can end further back
				// (prev.second is the largest peer)
				end -= UnsafeNumericCast<int64_t>(order_end - prev.end - 1);
			}
		}
	}

	if (FROM) {
		return idx_t(std::lower_bound(begin, end, val, comp));
	} else {
		return idx_t(std::upper_bound(begin, end, val, comp));
	}
}